

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O3

void __thiscall restincurl::Request::CallCompletion(Request *this,CURLcode cc)

{
  ostream *poVar1;
  undefined8 uVar2;
  Result result;
  CURLcode local_64;
  undefined1 local_60 [48];
  _Alloc_hider local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  local_64 = cc;
  Result::Result((Result *)local_60,&local_64);
  curl_easy_getinfo(((this->eh_)._M_t.
                     super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
                     .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl)->handle_,
                    0x200002,local_60 + 8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"Complete: http code: ",0x15);
  poVar1 = std::ostream::_M_insert<long>((long)&std::clog);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((this->completion_).super__Function_base._M_manager != (_Manager_type)0x0) {
    if ((this->default_data_buffer_)._M_string_length != 0) {
      std::__cxx11::string::operator=((string *)&local_30,(string *)&this->default_data_buffer_);
      if ((this->completion_).super__Function_base._M_manager == (_Manager_type)0x0) {
        uVar2 = std::__throw_bad_function_call();
        Result::~Result((Result *)local_60);
        _Unwind_Resume(uVar2);
      }
    }
    (*(this->completion_)._M_invoker)((_Any_data *)&this->completion_,(Result *)local_60);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_p != &local_20) {
    operator_delete(local_30._M_p,local_20._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_60._16_8_ != local_60 + 0x20) {
    operator_delete((void *)local_60._16_8_,local_60._32_8_ + 1);
  }
  return;
}

Assistant:

void CallCompletion(CURLcode cc) {
            Result result(cc);

            curl_easy_getinfo (*eh_, CURLINFO_RESPONSE_CODE,
                               &result.http_response_code);
            RESTINCURL_LOG("Complete: http code: " << result.http_response_code);
            if (completion_) {
                if (!default_data_buffer_.empty()) {
                    result.body = std::move(default_data_buffer_);
                }
                completion_(result);
            }
        }